

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O0

Status * __thiscall draco::ObjDecoder::DecodeInternal(ObjDecoder *this)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  size_type sVar6;
  pointer pAVar7;
  DecoderBuffer *this_00;
  reference this_01;
  ObjDecoder *in_RSI;
  Status *in_RDI;
  int c;
  FaceIndex i_4;
  Face face;
  AttributeValueIndex i_3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *itr_2;
  iterator __end3_1;
  iterator __begin3_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range3_1;
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
  sub_obj_metadata;
  AttributeValueIndex i_2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *itr_1;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range2_1;
  GeometryAttribute va_5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *itr;
  iterator __end3;
  iterator __begin3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range3;
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
  material_metadata;
  AttributeValueIndex avi_1;
  int i_1;
  Type geometry_attribute_type;
  GeometryAttribute va_4;
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> metadata;
  AttributeValueIndex avi;
  uint8_t i;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<int> *__range2;
  PointCloud *pc;
  GeometryAttribute va_3;
  GeometryAttribute va_2;
  GeometryAttribute va_1;
  GeometryAttribute va;
  bool use_identity_mapping;
  Status status;
  pointer in_stack_fffffffffffffa18;
  Code CVar8;
  PointCloud *in_stack_fffffffffffffa20;
  DataType in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa2c;
  uint8_t uVar9;
  undefined4 in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa34;
  undefined1 in_stack_fffffffffffffa35;
  undefined1 in_stack_fffffffffffffa36;
  undefined1 uVar10;
  undefined1 in_stack_fffffffffffffa37;
  size_t in_stack_fffffffffffffa38;
  Type TVar11;
  Mesh *in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa48;
  int in_stack_fffffffffffffa4c;
  allocator<char> *in_stack_fffffffffffffa50;
  char *in_stack_fffffffffffffa58;
  allocator<char> *__s;
  GeometryAttribute *in_stack_fffffffffffffa60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  PointCloud *in_stack_fffffffffffffa68;
  int32_t att_id;
  PointCloud *in_stack_fffffffffffffa70;
  PointCloud *this_03;
  bool local_492;
  uint local_474;
  int local_470;
  uint local_46c;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_468 [4];
  allocator<char> local_458 [12];
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_44c;
  reference local_448;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_440;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_438;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_430;
  allocator<char> local_421;
  string local_420 [39];
  undefined1 local_3f9 [33];
  undefined1 local_3d8 [12];
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_3cc;
  undefined1 local_3c8 [16];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_3b8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_3b0;
  allocator<char> local_359;
  string local_358 [32];
  reference local_338;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_330;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_328;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_320;
  allocator<char> local_311;
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8 [40];
  uint local_2c0;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_2bc;
  uint local_2b8;
  undefined4 local_2b4;
  allocator<char> local_261;
  string local_260 [39];
  allocator<char> local_239;
  string local_238 [44];
  uint local_20c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_208;
  byte local_201;
  byte *local_200;
  byte *local_1f8;
  int local_1f0 [2];
  initializer_list<int> local_1e8;
  initializer_list<int> *local_1d8;
  PointCloud *local_1d0;
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [39];
  allocator<char> local_71;
  string local_70 [39];
  undefined1 local_49;
  undefined4 local_48;
  Status local_38;
  
  in_RSI->counting_mode_ = true;
  ResetCounters(in_RSI);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *)0x1149e6);
  in_RSI->last_sub_obj_id_ = 0;
  Status::Status((Status *)in_stack_fffffffffffffa20,
                 (Code)((ulong)in_stack_fffffffffffffa18 >> 0x20));
  do {
    bVar1 = ParseDefinition((ObjDecoder *)
                            CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                            (Status *)in_stack_fffffffffffffa20);
    local_492 = false;
    if (bVar1) {
      local_492 = Status::ok(&local_38);
    }
  } while (local_492 != false);
  bVar1 = Status::ok(&local_38);
  if (!bVar1) {
    Status::Status((Status *)in_stack_fffffffffffffa20,(Status *)in_stack_fffffffffffffa18);
    goto LAB_00116238;
  }
  if ((in_RSI->mesh_files_ !=
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffa37,
                            CONCAT16(in_stack_fffffffffffffa36,
                                     CONCAT15(in_stack_fffffffffffffa35,
                                              CONCAT14(in_stack_fffffffffffffa34,
                                                       in_stack_fffffffffffffa30)))),
                (value_type *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  }
  local_49 = 0;
  if (in_RSI->num_obj_faces_ == 0) {
    if (in_RSI->num_positions_ == 0) {
      std::allocator<char>::allocator();
      CVar8 = (Code)((ulong)in_stack_fffffffffffffa18 >> 0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
      Status::Status((Status *)in_stack_fffffffffffffa20,CVar8,(string *)0x114b8b);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator(&local_71);
      goto LAB_00116238;
    }
    if ((0 < in_RSI->num_tex_coords_) && (in_RSI->num_tex_coords_ != in_RSI->num_positions_)) {
      std::allocator<char>::allocator();
      CVar8 = (Code)((ulong)in_stack_fffffffffffffa18 >> 0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
      Status::Status((Status *)in_stack_fffffffffffffa20,CVar8,(string *)0x114c73);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator(&local_99);
      goto LAB_00116238;
    }
    if ((0 < in_RSI->num_normals_) && (in_RSI->num_normals_ != in_RSI->num_positions_)) {
      std::allocator<char>::allocator();
      CVar8 = (Code)((ulong)in_stack_fffffffffffffa18 >> 0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
      Status::Status((Status *)in_stack_fffffffffffffa20,CVar8,(string *)0x114d5b);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator(&local_c1);
      goto LAB_00116238;
    }
    in_RSI->out_mesh_ = (Mesh *)0x0;
    local_49 = 1;
  }
  if (in_RSI->out_mesh_ != (Mesh *)0x0) {
    Mesh::SetNumFaces(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  }
  if (in_RSI->num_obj_faces_ < 1) {
    PointCloud::set_num_points(in_RSI->out_point_cloud_,in_RSI->num_positions_);
  }
  else {
    PointCloud::set_num_points(in_RSI->out_point_cloud_,in_RSI->num_obj_faces_ * 3);
  }
  if (0 < in_RSI->num_positions_) {
    GeometryAttribute::GeometryAttribute((GeometryAttribute *)in_stack_fffffffffffffa20);
    in_stack_fffffffffffffa20 = (PointCloud *)0x0;
    in_stack_fffffffffffffa18 = (pointer)&DAT_0000000c;
    GeometryAttribute::Init
              ((GeometryAttribute *)in_stack_fffffffffffffa40,
               (Type)(in_stack_fffffffffffffa38 >> 0x20),
               (DataBuffer *)
               CONCAT17(in_stack_fffffffffffffa37,
                        CONCAT16(in_stack_fffffffffffffa36,
                                 CONCAT15(in_stack_fffffffffffffa35,
                                          CONCAT14(in_stack_fffffffffffffa34,
                                                   in_stack_fffffffffffffa30)))),
               (uint8_t)((uint)in_stack_fffffffffffffa2c >> 0x18),in_stack_fffffffffffffa28,false,
               (int64_t)in_stack_fffffffffffffa50,(int64_t)in_stack_fffffffffffffa58);
    iVar3 = PointCloud::AddAttribute
                      (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                       SUB81((ulong)in_stack_fffffffffffffa58 >> 0x38,0),
                       (ValueType)in_stack_fffffffffffffa58);
    in_RSI->pos_att_id_ = iVar3;
  }
  if (0 < in_RSI->num_tex_coords_) {
    GeometryAttribute::GeometryAttribute((GeometryAttribute *)in_stack_fffffffffffffa20);
    in_stack_fffffffffffffa20 = (PointCloud *)0x0;
    in_stack_fffffffffffffa18 = (pointer)0x8;
    GeometryAttribute::Init
              ((GeometryAttribute *)in_stack_fffffffffffffa40,
               (Type)(in_stack_fffffffffffffa38 >> 0x20),
               (DataBuffer *)
               CONCAT17(in_stack_fffffffffffffa37,
                        CONCAT16(in_stack_fffffffffffffa36,
                                 CONCAT15(in_stack_fffffffffffffa35,
                                          CONCAT14(in_stack_fffffffffffffa34,
                                                   in_stack_fffffffffffffa30)))),
               (uint8_t)((uint)in_stack_fffffffffffffa2c >> 0x18),in_stack_fffffffffffffa28,false,
               (int64_t)in_stack_fffffffffffffa50,(int64_t)in_stack_fffffffffffffa58);
    iVar3 = PointCloud::AddAttribute
                      (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                       SUB81((ulong)in_stack_fffffffffffffa58 >> 0x38,0),
                       (ValueType)in_stack_fffffffffffffa58);
    in_RSI->tex_att_id_ = iVar3;
  }
  if (0 < in_RSI->num_normals_) {
    GeometryAttribute::GeometryAttribute((GeometryAttribute *)in_stack_fffffffffffffa20);
    in_stack_fffffffffffffa20 = (PointCloud *)0x0;
    in_stack_fffffffffffffa18 = (pointer)&DAT_0000000c;
    GeometryAttribute::Init
              ((GeometryAttribute *)in_stack_fffffffffffffa40,
               (Type)(in_stack_fffffffffffffa38 >> 0x20),
               (DataBuffer *)
               CONCAT17(in_stack_fffffffffffffa37,
                        CONCAT16(in_stack_fffffffffffffa36,
                                 CONCAT15(in_stack_fffffffffffffa35,
                                          CONCAT14(in_stack_fffffffffffffa34,
                                                   in_stack_fffffffffffffa30)))),
               (uint8_t)((uint)in_stack_fffffffffffffa2c >> 0x18),in_stack_fffffffffffffa28,false,
               (int64_t)in_stack_fffffffffffffa50,(int64_t)in_stack_fffffffffffffa58);
    iVar3 = PointCloud::AddAttribute
                      (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                       SUB81((ulong)in_stack_fffffffffffffa58 >> 0x38,0),
                       (ValueType)in_stack_fffffffffffffa58);
    in_RSI->norm_att_id_ = iVar3;
  }
  if (((in_RSI->preserve_polygons_ & 1U) != 0) && ((in_RSI->has_polygons_ & 1U) != 0)) {
    GeometryAttribute::GeometryAttribute((GeometryAttribute *)in_stack_fffffffffffffa20);
    in_stack_fffffffffffffa20 = (PointCloud *)0x0;
    in_stack_fffffffffffffa18 = (pointer)0x1;
    GeometryAttribute::Init
              ((GeometryAttribute *)in_stack_fffffffffffffa40,
               (Type)(in_stack_fffffffffffffa38 >> 0x20),
               (DataBuffer *)
               CONCAT17(in_stack_fffffffffffffa37,
                        CONCAT16(in_stack_fffffffffffffa36,
                                 CONCAT15(in_stack_fffffffffffffa35,
                                          CONCAT14(in_stack_fffffffffffffa34,
                                                   in_stack_fffffffffffffa30)))),
               (uint8_t)((uint)in_stack_fffffffffffffa2c >> 0x18),in_stack_fffffffffffffa28,false,
               (int64_t)in_stack_fffffffffffffa50,(int64_t)in_stack_fffffffffffffa58);
    local_1d0 = in_RSI->out_point_cloud_;
    iVar3 = PointCloud::AddAttribute
                      (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                       SUB81((ulong)in_stack_fffffffffffffa58 >> 0x38,0),
                       (ValueType)in_stack_fffffffffffffa58);
    in_RSI->added_edge_att_id_ = iVar3;
    local_1f0[0] = 0;
    local_1f0[1] = 1;
    local_1e8._M_array = local_1f0;
    local_1e8._M_len = 2;
    local_1d8 = &local_1e8;
    local_1f8 = (byte *)std::initializer_list<int>::begin(local_1d8);
    local_200 = (byte *)std::initializer_list<int>::end
                                  ((initializer_list<int> *)in_stack_fffffffffffffa20);
    for (; local_1f8 != local_200; local_1f8 = local_1f8 + 4) {
      local_201 = *local_1f8;
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType
                (&local_208,(uint)local_201);
      PointCloud::attribute
                (in_stack_fffffffffffffa20,(int32_t)((ulong)in_stack_fffffffffffffa18 >> 0x20));
      local_20c = local_208.value_;
      GeometryAttribute::SetAttributeValue
                ((GeometryAttribute *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                 (AttributeValueIndex)(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                 in_stack_fffffffffffffa40);
    }
    operator_new(0x68);
    AttributeMetadata::AttributeMetadata((AttributeMetadata *)in_stack_fffffffffffffa20);
    std::unique_ptr<draco::AttributeMetadata,std::default_delete<draco::AttributeMetadata>>::
    unique_ptr<std::default_delete<draco::AttributeMetadata>,void>
              ((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
    operator->((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                *)0x115255);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
    Metadata::AddEntryString
              ((Metadata *)in_stack_fffffffffffffa20,(string *)in_stack_fffffffffffffa18,
               (string *)0x1152e0);
    std::__cxx11::string::~string(local_260);
    std::allocator<char>::~allocator(&local_261);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator(&local_239);
    std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
    unique_ptr((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                *)in_stack_fffffffffffffa20,
               (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                *)in_stack_fffffffffffffa18);
    PointCloud::AddAttributeMetadata
              (in_stack_fffffffffffffa70,(int32_t)((ulong)in_stack_fffffffffffffa68 >> 0x20),
               (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                *)in_stack_fffffffffffffa60);
    std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
    ~unique_ptr((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                 *)in_stack_fffffffffffffa20);
    std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
    ~unique_ptr((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                 *)in_stack_fffffffffffffa20);
  }
  TVar11 = (Type)(in_stack_fffffffffffffa38 >> 0x20);
  if ((0 < in_RSI->num_materials_) && (0 < in_RSI->num_obj_faces_)) {
    GeometryAttribute::GeometryAttribute((GeometryAttribute *)in_stack_fffffffffffffa20);
    local_2b4 = 4;
    uVar9 = (uint8_t)((uint)in_stack_fffffffffffffa2c >> 0x18);
    TVar11 = (Type)(in_stack_fffffffffffffa38 >> 0x20);
    if (in_RSI->num_materials_ < 0x100) {
      in_stack_fffffffffffffa20 = (PointCloud *)0x0;
      in_stack_fffffffffffffa18 = (pointer)0x1;
      GeometryAttribute::Init
                ((GeometryAttribute *)in_stack_fffffffffffffa40,TVar11,
                 (DataBuffer *)
                 CONCAT17(in_stack_fffffffffffffa37,
                          CONCAT16(in_stack_fffffffffffffa36,
                                   CONCAT15(in_stack_fffffffffffffa35,
                                            CONCAT14(in_stack_fffffffffffffa34,
                                                     in_stack_fffffffffffffa30)))),uVar9,
                 in_stack_fffffffffffffa28,false,(int64_t)in_stack_fffffffffffffa50,
                 (int64_t)in_stack_fffffffffffffa58);
    }
    else if (in_RSI->num_materials_ < 0x10000) {
      in_stack_fffffffffffffa20 = (PointCloud *)0x0;
      in_stack_fffffffffffffa18 = (pointer)0x2;
      GeometryAttribute::Init
                ((GeometryAttribute *)in_stack_fffffffffffffa40,TVar11,
                 (DataBuffer *)
                 CONCAT17(in_stack_fffffffffffffa37,
                          CONCAT16(in_stack_fffffffffffffa36,
                                   CONCAT15(in_stack_fffffffffffffa35,
                                            CONCAT14(in_stack_fffffffffffffa34,
                                                     in_stack_fffffffffffffa30)))),uVar9,
                 in_stack_fffffffffffffa28,false,(int64_t)in_stack_fffffffffffffa50,
                 (int64_t)in_stack_fffffffffffffa58);
    }
    else {
      in_stack_fffffffffffffa20 = (PointCloud *)0x0;
      in_stack_fffffffffffffa18 = (pointer)0x4;
      GeometryAttribute::Init
                ((GeometryAttribute *)in_stack_fffffffffffffa40,TVar11,
                 (DataBuffer *)
                 CONCAT17(in_stack_fffffffffffffa37,
                          CONCAT16(in_stack_fffffffffffffa36,
                                   CONCAT15(in_stack_fffffffffffffa35,
                                            CONCAT14(in_stack_fffffffffffffa34,
                                                     in_stack_fffffffffffffa30)))),uVar9,
                 in_stack_fffffffffffffa28,false,(int64_t)in_stack_fffffffffffffa50,
                 (int64_t)in_stack_fffffffffffffa58);
    }
    iVar3 = PointCloud::AddAttribute
                      (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                       SUB81((ulong)in_stack_fffffffffffffa58 >> 0x38,0),
                       (ValueType)in_stack_fffffffffffffa58);
    in_RSI->material_att_id_ = iVar3;
    for (local_2b8 = 0; TVar11 = (Type)(in_stack_fffffffffffffa38 >> 0x20),
        (int)local_2b8 < in_RSI->num_materials_; local_2b8 = local_2b8 + 1) {
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_2bc,local_2b8)
      ;
      PointCloud::attribute
                (in_stack_fffffffffffffa20,(int32_t)((ulong)in_stack_fffffffffffffa18 >> 0x20));
      local_2c0 = local_2bc.value_;
      GeometryAttribute::SetAttributeValue
                ((GeometryAttribute *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                 (AttributeValueIndex)(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                 in_stack_fffffffffffffa40);
    }
    if ((in_RSI->use_metadata_ & 1U) != 0) {
      operator_new(0x68);
      AttributeMetadata::AttributeMetadata((AttributeMetadata *)in_stack_fffffffffffffa20);
      std::unique_ptr<draco::AttributeMetadata,std::default_delete<draco::AttributeMetadata>>::
      unique_ptr<std::default_delete<draco::AttributeMetadata>,void>
                ((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                  *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
      std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
      operator->((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                  *)0x1156ac);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
      Metadata::AddEntryString
                ((Metadata *)in_stack_fffffffffffffa20,(string *)in_stack_fffffffffffffa18,
                 (string *)0x115737);
      std::__cxx11::string::~string(local_310);
      std::allocator<char>::~allocator(&local_311);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator(&local_2e9);
      local_320 = &in_RSI->material_name_to_id_;
      local_328._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)in_stack_fffffffffffffa18);
      local_330._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)in_stack_fffffffffffffa18);
      while( true ) {
        bVar1 = std::__detail::operator!=(&local_328,&local_330);
        TVar11 = (Type)(in_stack_fffffffffffffa38 >> 0x20);
        if (!bVar1) break;
        local_338 = std::__detail::
                    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                    ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                                 *)0x1157d8);
        std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
        operator->((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                    *)0x1157ed);
        Metadata::AddEntryInt
                  ((Metadata *)in_stack_fffffffffffffa20,(string *)in_stack_fffffffffffffa18,0);
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                      *)in_stack_fffffffffffffa20);
      }
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
        operator->((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                    *)0x1158f6);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
        Metadata::AddEntryString
                  ((Metadata *)in_stack_fffffffffffffa20,(string *)in_stack_fffffffffffffa18,
                   (string *)0x115952);
        std::__cxx11::string::~string(local_358);
        std::allocator<char>::~allocator(&local_359);
      }
      std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
      unique_ptr((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                  *)in_stack_fffffffffffffa20,
                 (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                  *)in_stack_fffffffffffffa18);
      PointCloud::AddAttributeMetadata
                (in_stack_fffffffffffffa70,(int32_t)((ulong)in_stack_fffffffffffffa68 >> 0x20),
                 (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                  *)in_stack_fffffffffffffa60);
      std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
      ~unique_ptr((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                   *)in_stack_fffffffffffffa20);
      std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
      ~unique_ptr((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                   *)in_stack_fffffffffffffa20);
    }
  }
  bVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::empty((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)0x115a7a);
  if ((!bVar1) && (0 < in_RSI->num_obj_faces_)) {
    GeometryAttribute::GeometryAttribute((GeometryAttribute *)in_stack_fffffffffffffa20);
    sVar6 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)0x115ab7);
    if (sVar6 < 0x100) {
      in_stack_fffffffffffffa20 = (PointCloud *)0x0;
      in_stack_fffffffffffffa18 = (pointer)0x1;
      GeometryAttribute::Init
                ((GeometryAttribute *)in_stack_fffffffffffffa40,TVar11,
                 (DataBuffer *)
                 CONCAT17(in_stack_fffffffffffffa37,
                          CONCAT16(in_stack_fffffffffffffa36,
                                   CONCAT15(in_stack_fffffffffffffa35,
                                            CONCAT14(in_stack_fffffffffffffa34,
                                                     in_stack_fffffffffffffa30)))),
                 (uint8_t)((uint)in_stack_fffffffffffffa2c >> 0x18),in_stack_fffffffffffffa28,false,
                 (int64_t)in_stack_fffffffffffffa50,(int64_t)in_stack_fffffffffffffa58);
    }
    else {
      sVar6 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)0x115b0f);
      uVar9 = (uint8_t)((uint)in_stack_fffffffffffffa2c >> 0x18);
      if (sVar6 < 0x10000) {
        in_stack_fffffffffffffa20 = (PointCloud *)0x0;
        in_stack_fffffffffffffa18 = (pointer)0x2;
        GeometryAttribute::Init
                  ((GeometryAttribute *)in_stack_fffffffffffffa40,TVar11,
                   (DataBuffer *)
                   CONCAT17(in_stack_fffffffffffffa37,
                            CONCAT16(in_stack_fffffffffffffa36,
                                     CONCAT15(in_stack_fffffffffffffa35,
                                              CONCAT14(in_stack_fffffffffffffa34,
                                                       in_stack_fffffffffffffa30)))),uVar9,
                   in_stack_fffffffffffffa28,false,(int64_t)in_stack_fffffffffffffa50,
                   (int64_t)in_stack_fffffffffffffa58);
      }
      else {
        in_stack_fffffffffffffa20 = (PointCloud *)0x0;
        in_stack_fffffffffffffa18 = (pointer)0x4;
        GeometryAttribute::Init
                  ((GeometryAttribute *)in_stack_fffffffffffffa40,TVar11,
                   (DataBuffer *)
                   CONCAT17(in_stack_fffffffffffffa37,
                            CONCAT16(in_stack_fffffffffffffa36,
                                     CONCAT15(in_stack_fffffffffffffa35,
                                              CONCAT14(in_stack_fffffffffffffa34,
                                                       in_stack_fffffffffffffa30)))),uVar9,
                   in_stack_fffffffffffffa28,false,(int64_t)in_stack_fffffffffffffa50,
                   (int64_t)in_stack_fffffffffffffa58);
      }
    }
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)0x115ba9);
    iVar3 = PointCloud::AddAttribute
                      (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                       SUB81((ulong)in_stack_fffffffffffffa58 >> 0x38,0),
                       (ValueType)in_stack_fffffffffffffa58);
    in_RSI->sub_obj_att_id_ = iVar3;
    local_3b0 = &in_RSI->obj_name_to_id_;
    local_3b8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)in_stack_fffffffffffffa18);
    local_3c8._8_8_ =
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)in_stack_fffffffffffffa18);
    while (bVar1 = std::__detail::operator!=
                             (&local_3b8,
                              (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                               *)(local_3c8 + 8)), bVar1) {
      local_3c8._0_8_ =
           std::__detail::
           _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
           ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                        *)0x115c37);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType
                (&local_3cc,((reference)local_3c8._0_8_)->second);
      PointCloud::attribute
                (in_stack_fffffffffffffa20,(int32_t)((ulong)in_stack_fffffffffffffa18 >> 0x20));
      local_3d8._8_4_ = local_3cc.value_;
      GeometryAttribute::SetAttributeValue
                ((GeometryAttribute *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                 (AttributeValueIndex)(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                 in_stack_fffffffffffffa40);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                    *)in_stack_fffffffffffffa20);
    }
    if ((in_RSI->use_metadata_ & 1U) != 0) {
      operator_new(0x68);
      AttributeMetadata::AttributeMetadata((AttributeMetadata *)in_stack_fffffffffffffa20);
      this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8;
      std::unique_ptr<draco::AttributeMetadata,std::default_delete<draco::AttributeMetadata>>::
      unique_ptr<std::default_delete<draco::AttributeMetadata>,void>
                ((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                  *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
      pAVar7 = std::
               unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
               ::operator->((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                             *)0x115d07);
      this_03 = (PointCloud *)local_3f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_02,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
      __s = &local_421;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_02,(char *)__s,in_stack_fffffffffffffa50);
      Metadata::AddEntryString
                ((Metadata *)in_stack_fffffffffffffa20,(string *)in_stack_fffffffffffffa18,
                 (string *)0x115d80);
      std::__cxx11::string::~string(local_420);
      std::allocator<char>::~allocator(&local_421);
      std::__cxx11::string::~string((string *)(local_3f9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_3f9);
      local_430 = &in_RSI->obj_name_to_id_;
      local_438._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)in_stack_fffffffffffffa18);
      local_440._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)in_stack_fffffffffffffa18);
      while( true ) {
        bVar1 = std::__detail::operator!=(&local_438,&local_440);
        att_id = (int32_t)((ulong)pAVar7 >> 0x20);
        if (!bVar1) break;
        local_448 = std::__detail::
                    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                    ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                                 *)0x115e21);
        IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType
                  (&local_44c,local_448->second);
        std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
        operator->((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                    *)0x115e50);
        Metadata::AddEntryInt
                  ((Metadata *)in_stack_fffffffffffffa20,(string *)in_stack_fffffffffffffa18,0);
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                      *)in_stack_fffffffffffffa20);
      }
      in_stack_fffffffffffffa40 = (Mesh *)in_RSI->out_point_cloud_;
      in_stack_fffffffffffffa4c = in_RSI->sub_obj_att_id_;
      in_stack_fffffffffffffa50 = local_458;
      std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
      unique_ptr((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                  *)in_stack_fffffffffffffa20,
                 (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                  *)in_stack_fffffffffffffa18);
      PointCloud::AddAttributeMetadata
                (this_03,att_id,
                 (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                  *)this_02);
      std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
      ~unique_ptr((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                   *)in_stack_fffffffffffffa20);
      std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
      ~unique_ptr((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                   *)in_stack_fffffffffffffa20);
    }
  }
  in_RSI->counting_mode_ = false;
  ResetCounters(in_RSI);
  this_00 = buffer(in_RSI);
  DecoderBuffer::StartDecodingFrom(this_00,0);
  do {
    uVar2 = ParseDefinition((ObjDecoder *)
                            CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                            (Status *)in_stack_fffffffffffffa20);
    uVar10 = false;
    if ((bool)uVar2) {
      in_stack_fffffffffffffa35 = Status::ok(&local_38);
      uVar10 = in_stack_fffffffffffffa35;
    }
  } while ((bool)uVar10 != false);
  bVar1 = Status::ok(&local_38);
  if (bVar1) {
    if (in_RSI->out_mesh_ != (Mesh *)0x0) {
      std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::array
                ((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *)
                 CONCAT17(uVar2,CONCAT16(uVar10,CONCAT15(in_stack_fffffffffffffa35,
                                                         CONCAT14(bVar1,in_stack_fffffffffffffa30)))
                         ));
      IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(local_468,0);
      while( true ) {
        local_46c = in_RSI->num_obj_faces_;
        bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator<(local_468,&local_46c)
        ;
        if (!bVar1) break;
        for (local_470 = 0; local_470 < 3; local_470 = local_470 + 1) {
          uVar4 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value(local_468);
          local_474 = uVar4 * 3 + local_470;
          this_01 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
                    operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                                *)in_stack_fffffffffffffa20,(size_type)in_stack_fffffffffffffa18);
          IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator=(this_01,&local_474);
        }
        Mesh::SetFace((Mesh *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                      (FaceIndex)(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                      (Face *)in_stack_fffffffffffffa40);
        IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator++(local_468);
      }
    }
    if ((in_RSI->deduplicate_input_values_ & 1U) != 0) {
      (*in_RSI->out_point_cloud_->_vptr_PointCloud[4])();
    }
    (*in_RSI->out_point_cloud_->_vptr_PointCloud[5])();
    Status::Status((Status *)in_stack_fffffffffffffa20,(Status *)in_stack_fffffffffffffa18);
  }
  else {
    Status::Status((Status *)in_stack_fffffffffffffa20,(Status *)in_stack_fffffffffffffa18);
  }
LAB_00116238:
  local_48 = 1;
  Status::~Status((Status *)0x116245);
  return in_RDI;
}

Assistant:

Status ObjDecoder::DecodeInternal() {
  // In the first pass, count the number of different elements in the geometry.
  // In case the desired output is just a point cloud (i.e., when
  // out_mesh_ == nullptr) the decoder will ignore all information about the
  // connectivity that may be included in the source data.
  counting_mode_ = true;
  ResetCounters();
  material_name_to_id_.clear();
  last_sub_obj_id_ = 0;
  // Parse all lines.
  Status status(Status::OK);
  while (ParseDefinition(&status) && status.ok()) {
  }
  if (!status.ok()) {
    return status;
  }

  if (mesh_files_ && !input_file_name_.empty()) {
    mesh_files_->push_back(input_file_name_);
  }

  bool use_identity_mapping = false;
  if (num_obj_faces_ == 0) {
    // Mesh has no faces. In this case we try to read the geometry as a point
    // cloud where every attribute entry is a point.

    // Ensure the number of all entries is same for all attributes.
    if (num_positions_ == 0) {
      return Status(Status::DRACO_ERROR, "No position attribute");
    }
    if (num_tex_coords_ > 0 && num_tex_coords_ != num_positions_) {
      return Status(Status::DRACO_ERROR,
                    "Invalid number of texture coordinates for a point cloud");
    }
    if (num_normals_ > 0 && num_normals_ != num_positions_) {
      return Status(Status::DRACO_ERROR,
                    "Invalid number of normals for a point cloud");
    }

    out_mesh_ = nullptr;  // Treat the output geometry as a point cloud.
    use_identity_mapping = true;
  }

  // Initialize point cloud and mesh properties.
  if (out_mesh_) {
    // Start decoding a mesh with the given number of faces. For point clouds we
    // silently ignore all data about the mesh connectivity.
    out_mesh_->SetNumFaces(num_obj_faces_);
  }
  if (num_obj_faces_ > 0) {
    out_point_cloud_->set_num_points(3 * num_obj_faces_);
  } else {
    out_point_cloud_->set_num_points(num_positions_);
  }

  // Add attributes if they are present in the input data.
  if (num_positions_ > 0) {
    GeometryAttribute va;
    va.Init(GeometryAttribute::POSITION, nullptr, 3, DT_FLOAT32, false,
            sizeof(float) * 3, 0);
    pos_att_id_ = out_point_cloud_->AddAttribute(va, use_identity_mapping,
                                                 num_positions_);
  }
  if (num_tex_coords_ > 0) {
    GeometryAttribute va;
    va.Init(GeometryAttribute::TEX_COORD, nullptr, 2, DT_FLOAT32, false,
            sizeof(float) * 2, 0);
    tex_att_id_ = out_point_cloud_->AddAttribute(va, use_identity_mapping,
                                                 num_tex_coords_);
  }
  if (num_normals_ > 0) {
    GeometryAttribute va;
    va.Init(GeometryAttribute::NORMAL, nullptr, 3, DT_FLOAT32, false,
            sizeof(float) * 3, 0);
    norm_att_id_ =
        out_point_cloud_->AddAttribute(va, use_identity_mapping, num_normals_);
  }
  if (preserve_polygons_ && has_polygons_) {
    // Create attribute for polygon reconstruction.
    GeometryAttribute va;
    va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT8, false, 1, 0);
    PointCloud *const pc = out_point_cloud_;
    added_edge_att_id_ = pc->AddAttribute(va, false, 2);

    // Set attribute values to zero and one representing old edge and new edge.
    for (const uint8_t i : {0, 1}) {
      const AttributeValueIndex avi(i);
      pc->attribute(added_edge_att_id_)->SetAttributeValue(avi, &i);
    }

    // Add attribute metadata with name.
    std::unique_ptr<AttributeMetadata> metadata(new draco::AttributeMetadata());
    metadata->AddEntryString("name", "added_edges");
    pc->AddAttributeMetadata(added_edge_att_id_, std::move(metadata));
  }
  if (num_materials_ > 0 && num_obj_faces_ > 0) {
    GeometryAttribute va;
    const auto geometry_attribute_type = GeometryAttribute::GENERIC;
    if (num_materials_ < 256) {
      va.Init(geometry_attribute_type, nullptr, 1, DT_UINT8, false, 1, 0);
    } else if (num_materials_ < (1 << 16)) {
      va.Init(geometry_attribute_type, nullptr, 1, DT_UINT16, false, 2, 0);
    } else {
      va.Init(geometry_attribute_type, nullptr, 1, DT_UINT32, false, 4, 0);
    }
    material_att_id_ =
        out_point_cloud_->AddAttribute(va, false, num_materials_);

    // Fill the material entries.
    for (int i = 0; i < num_materials_; ++i) {
      const AttributeValueIndex avi(i);
      out_point_cloud_->attribute(material_att_id_)->SetAttributeValue(avi, &i);
    }

    if (use_metadata_) {
      // Use metadata to store the name of materials.
      std::unique_ptr<AttributeMetadata> material_metadata =
          std::unique_ptr<AttributeMetadata>(new AttributeMetadata());
      material_metadata->AddEntryString("name", "material");
      // Add all material names.
      for (const auto &itr : material_name_to_id_) {
        material_metadata->AddEntryInt(itr.first, itr.second);
      }
      if (!material_file_name_.empty()) {
        material_metadata->AddEntryString("file_name", material_file_name_);
      }

      out_point_cloud_->AddAttributeMetadata(material_att_id_,
                                             std::move(material_metadata));
    }
  }
  if (!obj_name_to_id_.empty() && num_obj_faces_ > 0) {
    GeometryAttribute va;
    if (obj_name_to_id_.size() < 256) {
      va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT8, false, 1, 0);
    } else if (obj_name_to_id_.size() < (1 << 16)) {
      va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT16, false, 2, 0);
    } else {
      va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT32, false, 4, 0);
    }
    sub_obj_att_id_ = out_point_cloud_->AddAttribute(
        va, false, static_cast<uint32_t>(obj_name_to_id_.size()));
    // Fill the sub object id entries.
    for (const auto &itr : obj_name_to_id_) {
      const AttributeValueIndex i(itr.second);
      out_point_cloud_->attribute(sub_obj_att_id_)->SetAttributeValue(i, &i);
    }
    if (use_metadata_) {
      // Use metadata to store the name of materials.
      std::unique_ptr<AttributeMetadata> sub_obj_metadata =
          std::unique_ptr<AttributeMetadata>(new AttributeMetadata());
      sub_obj_metadata->AddEntryString("name", "sub_obj");
      // Add all sub object names.
      for (const auto &itr : obj_name_to_id_) {
        const AttributeValueIndex i(itr.second);
        sub_obj_metadata->AddEntryInt(itr.first, itr.second);
      }
      out_point_cloud_->AddAttributeMetadata(sub_obj_att_id_,
                                             std::move(sub_obj_metadata));
    }
  }

  // Perform a second iteration of parsing and fill all the data.
  counting_mode_ = false;
  ResetCounters();
  // Start parsing from the beginning of the buffer again.
  buffer()->StartDecodingFrom(0);
  while (ParseDefinition(&status) && status.ok()) {
  }
  if (!status.ok()) {
    return status;
  }
  if (out_mesh_) {
    // Add faces with identity mapping between vertex and corner indices.
    // Duplicate vertices will get removed later.
    Mesh::Face face;
    for (FaceIndex i(0); i < num_obj_faces_; ++i) {
      for (int c = 0; c < 3; ++c) {
        face[c] = 3 * i.value() + c;
      }
      out_mesh_->SetFace(i, face);
    }
  }

#ifdef DRACO_ATTRIBUTE_VALUES_DEDUPLICATION_SUPPORTED
  if (deduplicate_input_values_) {
    out_point_cloud_->DeduplicateAttributeValues();
  }
#endif
#ifdef DRACO_ATTRIBUTE_INDICES_DEDUPLICATION_SUPPORTED
  out_point_cloud_->DeduplicatePointIds();
#endif
  return status;
}